

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::execute
          (RowSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  int iVar25;
  VarStatus VVar26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  VarStatus *pVVar28;
  pointer pnVar29;
  undefined8 uVar30;
  cpp_dec_float<50U,_int,_void> *pcVar31;
  cpp_dec_float<50U,_int,_void> *pcVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  long lVar34;
  long lVar35;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar36;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  cpp_dec_float<50U,_int,_void> local_d48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d08;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_cf8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_cf0;
  cpp_dec_float<50U,_int,_void> local_ce8;
  cpp_dec_float<50U,_int,_void> local_cb0;
  cpp_dec_float<50U,_int,_void> local_c78;
  cpp_dec_float<50U,_int,_void> local_c38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bf8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bf0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb8;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  int local_b50;
  undefined1 local_b4c;
  undefined8 local_b48;
  cpp_dec_float<50U,_int,_void> local_b38;
  uint local_af8 [2];
  uint auStack_af0 [2];
  uint local_ae8;
  uint uStack_ae4;
  uint uStack_ae0;
  uint uStack_adc;
  uint local_ad8 [4];
  uint local_ac8 [2];
  uint auStack_ac0 [2];
  uint local_ab8;
  uint uStack_ab4;
  uint uStack_ab0;
  uint uStack_aac;
  uint local_aa8 [4];
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  uint local_a68 [2];
  uint auStack_a60 [2];
  uint local_a58;
  uint uStack_a54;
  uint uStack_a50;
  uint uStack_a4c;
  uint local_a48 [4];
  uint local_a38 [2];
  uint auStack_a30 [2];
  uint local_a28;
  uint uStack_a24;
  uint uStack_a20;
  uint uStack_a1c;
  uint local_a18 [4];
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  uint local_9d8 [2];
  uint auStack_9d0 [2];
  uint local_9c8;
  uint uStack_9c4;
  uint uStack_9c0;
  uint uStack_9bc;
  uint local_9b8 [4];
  uint local_9a8 [2];
  uint auStack_9a0 [2];
  uint local_998 [2];
  undefined8 uStack_990;
  uint local_988 [4];
  uint local_978 [2];
  uint auStack_970 [2];
  uint local_968;
  uint uStack_964;
  uint uStack_960;
  uint uStack_95c;
  uint local_958 [4];
  uint local_948 [2];
  uint auStack_940 [2];
  uint local_938 [2];
  undefined8 uStack_930;
  uint local_928 [4];
  uint local_918 [2];
  uint auStack_910 [2];
  uint local_908;
  uint uStack_904;
  uint uStack_900;
  uint uStack_8fc;
  uint local_8f8 [4];
  uint local_8e8 [2];
  uint auStack_8e0 [2];
  uint local_8d8 [2];
  undefined8 uStack_8d0;
  uint local_8c8 [4];
  uint local_8b8 [2];
  uint auStack_8b0 [2];
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  uint local_898 [4];
  uint local_888 [2];
  uint auStack_880 [2];
  uint local_878 [2];
  undefined8 uStack_870;
  uint local_868 [4];
  uint local_858 [2];
  uint auStack_850 [2];
  uint local_848 [2];
  uint auStack_840 [2];
  uint local_838 [4];
  undefined8 local_828;
  undefined8 uStack_820;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  undefined8 local_808;
  uint local_7f8 [2];
  uint auStack_7f0 [2];
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  uint local_7d8 [4];
  uint local_7c8 [2];
  uint auStack_7c0 [2];
  uint local_7b8 [2];
  undefined8 uStack_7b0;
  uint local_7a8 [2];
  cpp_dec_float<50U,_int,_void> local_7a0;
  cpp_dec_float<50U,_int,_void> local_768;
  cpp_dec_float<50U,_int,_void> local_730;
  cpp_dec_float<50U,_int,_void> local_6f8;
  cpp_dec_float<50U,_int,_void> local_6c0;
  cpp_dec_float<50U,_int,_void> local_688;
  cpp_dec_float<50U,_int,_void> local_650;
  cpp_dec_float<50U,_int,_void> local_618;
  cpp_dec_float<50U,_int,_void> local_5e0;
  cpp_dec_float<50U,_int,_void> local_5a8;
  cpp_dec_float<50U,_int,_void> local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_500;
  cpp_dec_float<50U,_int,_void> local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  undefined1 local_408 [16];
  undefined1 local_3f8 [13];
  undefined3 uStack_3eb;
  undefined1 auStack_3e8 [13];
  undefined8 local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  undefined1 local_388 [16];
  undefined1 local_378 [13];
  undefined3 uStack_36b;
  undefined1 auStack_368 [13];
  undefined8 local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [13];
  undefined3 uStack_2ab;
  undefined1 auStack_2a8 [13];
  undefined8 local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  iVar25 = this->m_i;
  iVar4 = this->m_old_i;
  if (iVar25 != iVar4) {
    pnVar29 = (y->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar29[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
    uVar30 = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
    uVar19 = *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
    uVar20 = *(undefined8 *)(puVar2 + 2);
    puVar1 = pnVar29[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar1 + 2) = uVar20;
    *(undefined8 *)&pnVar29[iVar4].m_backend.data = uVar30;
    *(undefined8 *)(pnVar29[iVar4].m_backend.data._M_elems + 2) = uVar19;
    pnVar29[iVar4].m_backend.exp = pnVar29[iVar25].m_backend.exp;
    pnVar29[iVar4].m_backend.neg = pnVar29[iVar25].m_backend.neg;
    iVar21 = pnVar29[iVar25].m_backend.prec_elem;
    pnVar29[iVar4].m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
    pnVar29[iVar4].m_backend.prec_elem = iVar21;
    iVar25 = this->m_i;
    pnVar29 = (s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_i;
    *(undefined8 *)(pnVar29[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
    uVar30 = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
    uVar19 = *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
    uVar20 = *(undefined8 *)(puVar2 + 2);
    puVar1 = pnVar29[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar1 + 2) = uVar20;
    *(undefined8 *)&pnVar29[iVar4].m_backend.data = uVar30;
    *(undefined8 *)(pnVar29[iVar4].m_backend.data._M_elems + 2) = uVar19;
    pnVar29[iVar4].m_backend.exp = pnVar29[iVar25].m_backend.exp;
    pnVar29[iVar4].m_backend.neg = pnVar29[iVar25].m_backend.neg;
    iVar21 = pnVar29[iVar25].m_backend.prec_elem;
    pnVar29[iVar4].m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
    pnVar29[iVar4].m_backend.prec_elem = iVar21;
    iVar25 = this->m_i;
    rStatus->data[this->m_old_i] = rStatus->data[iVar25];
  }
  local_d00 = y;
  local_cf0 = cStatus;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_cb0,
               &(this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar25);
  pcVar32 = &(x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
  local_d48.fpclass = cpp_dec_float_finite;
  local_d48.prec_elem = 10;
  local_d48.data._M_elems[0] = 0;
  local_d48.data._M_elems[1] = 0;
  local_d48.data._M_elems[2] = 0;
  local_d48.data._M_elems[3] = 0;
  local_d48.data._M_elems[4] = 0;
  local_d48.data._M_elems[5] = 0;
  local_d48.data._M_elems._24_5_ = 0;
  local_d48.data._M_elems[7]._1_3_ = 0;
  local_d48.data._M_elems._32_5_ = 0;
  local_d48.data._M_elems[9]._1_3_ = 0;
  local_d48.exp = 0;
  local_d48.neg = false;
  pcVar33 = &local_cb0;
  if (&local_d48 != pcVar32) {
    local_d48.data._M_elems._32_5_ = local_cb0.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_cb0.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_cb0.data._M_elems[4];
    local_d48.data._M_elems[5] = local_cb0.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_cb0.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_cb0.data._M_elems[7]._1_3_;
    local_d48.data._M_elems[0] = local_cb0.data._M_elems[0];
    local_d48.data._M_elems[1] = local_cb0.data._M_elems[1];
    local_d48.data._M_elems[2] = local_cb0.data._M_elems[2];
    local_d48.data._M_elems[3] = local_cb0.data._M_elems[3];
    local_d48.exp = local_cb0.exp;
    local_d48.neg = local_cb0.neg;
    local_d48.prec_elem = local_cb0.prec_elem;
    local_d48.fpclass = local_cb0.fpclass;
    pcVar33 = pcVar32;
  }
  local_cf8 = x;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_d48,pcVar33);
  iVar25 = this->m_i;
  pnVar29 = (s->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar29[iVar25].m_backend.data._M_elems + 8) =
       CONCAT35(local_d48.data._M_elems[9]._1_3_,local_d48.data._M_elems._32_5_);
  puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_d48.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_d48.data._M_elems[7]._1_3_,local_d48.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar29[iVar25].m_backend.data = local_d48.data._M_elems._0_8_;
  *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2) = local_d48.data._M_elems._8_8_;
  pnVar29[iVar25].m_backend.exp = local_d48.exp;
  pnVar29[iVar25].m_backend.neg = local_d48.neg;
  pnVar29[iVar25].m_backend.fpclass = local_d48.fpclass;
  pnVar29[iVar25].m_backend.prec_elem = local_d48.prec_elem;
  local_ce8.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_ce8.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_ce8.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_ce8.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  local_ce8.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_ce8.exp = (this->m_obj).m_backend.exp;
  local_ce8.neg = (this->m_obj).m_backend.neg;
  local_ce8.fpclass = (this->m_obj).m_backend.fpclass;
  local_ce8.prec_elem = (this->m_obj).m_backend.prec_elem;
  iVar25 = (this->m_col).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar25) {
    lVar34 = 0;
    lVar35 = 0;
    do {
      pNVar6 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar6->val + 1) + lVar34);
      if (iVar4 != this->m_i) {
        pcVar33 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar34);
        pcVar31 = &(local_d00->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        local_d48.fpclass = cpp_dec_float_finite;
        local_d48.prec_elem = 10;
        local_d48.data._M_elems[0] = 0;
        local_d48.data._M_elems[1] = 0;
        local_d48.data._M_elems[2] = 0;
        local_d48.data._M_elems[3] = 0;
        local_d48.data._M_elems[4] = 0;
        local_d48.data._M_elems[5] = 0;
        local_d48.data._M_elems._24_5_ = 0;
        local_d48.data._M_elems[7]._1_3_ = 0;
        local_d48.data._M_elems._32_5_ = 0;
        local_d48.data._M_elems[9]._1_3_ = 0;
        local_d48.exp = 0;
        local_d48.neg = false;
        pcVar32 = pcVar33;
        if ((&local_d48 != pcVar31) && (pcVar32 = pcVar31, pcVar33 != &local_d48)) {
          uVar30 = *(undefined8 *)((pcVar33->data)._M_elems + 8);
          local_d48.data._M_elems._32_5_ = SUB85(uVar30,0);
          local_d48.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar30 >> 0x28);
          local_d48.data._M_elems._0_8_ = *(undefined8 *)(pcVar33->data)._M_elems;
          local_d48.data._M_elems._8_8_ = *(undefined8 *)((pcVar33->data)._M_elems + 2);
          local_d48.data._M_elems._16_8_ = *(undefined8 *)((pcVar33->data)._M_elems + 4);
          uVar30 = *(undefined8 *)((pcVar33->data)._M_elems + 6);
          local_d48.data._M_elems._24_5_ = SUB85(uVar30,0);
          local_d48.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar30 >> 0x28);
          local_d48.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar34);
          local_d48.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar34 + 4);
          local_d48._48_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar34 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_d48,pcVar32);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_ce8,&local_d48);
        iVar25 = (this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar35 = lVar35 + 1;
      lVar34 = lVar34 + 0x3c;
    } while (lVar35 < iVar25);
  }
  if (local_cb0.fpclass == cpp_dec_float_NaN) {
LAB_002f9241:
    lVar34 = 0x6c;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_d48,0,(type *)0x0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_cb0,&local_d48);
    lVar34 = 0x34;
    if (iVar25 < 1) goto LAB_002f9241;
  }
  local_c38.fpclass = cpp_dec_float_finite;
  local_c38.prec_elem = 10;
  local_c38.data._M_elems[0] = 0;
  local_c38.data._M_elems[1] = 0;
  local_c38.data._M_elems[2] = 0;
  local_c38.data._M_elems[3] = 0;
  local_c38.data._M_elems[4] = 0;
  local_c38.data._M_elems[5] = 0;
  local_c38.data._M_elems._24_5_ = 0;
  local_c38.data._M_elems[7]._1_3_ = 0;
  local_c38.data._M_elems[8] = 0;
  local_c38.data._M_elems[9] = 0;
  local_c38.exp = 0;
  local_c38.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_c38,
             (cpp_dec_float<50U,_int,_void> *)
             ((long)(this->m_lhs).m_backend.data._M_elems + lVar34 + -0x34),&local_cb0);
  if (local_cb0.fpclass == cpp_dec_float_NaN) {
LAB_002f92b2:
    lVar34 = 0x34;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_d48,0,(type *)0x0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_cb0,&local_d48);
    lVar34 = 0x6c;
    if (iVar25 < 1) goto LAB_002f92b2;
  }
  local_c78.fpclass = cpp_dec_float_finite;
  local_c78.prec_elem = 10;
  local_c78.data._M_elems[0] = 0;
  local_c78.data._M_elems[1] = 0;
  local_c78.data._M_elems[2] = 0;
  local_c78.data._M_elems[3] = 0;
  local_c78.data._M_elems[4] = 0;
  local_c78.data._M_elems[5] = 0;
  local_c78.data._M_elems[6] = 0;
  local_c78.data._M_elems[7] = 0;
  local_c78.data._M_elems[8] = 0;
  local_c78.data._M_elems[9] = 0;
  local_c78.exp = 0;
  local_c78.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_c78,
             (cpp_dec_float<50U,_int,_void> *)
             ((long)(this->m_lhs).m_backend.data._M_elems + lVar34 + -0x34),&local_cb0);
  iVar25 = this->m_j;
  VVar26 = local_cf0->data[iVar25];
  if (4 < (ulong)VVar26) {
    return;
  }
  pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)((long)&switchD_002f9317::switchdataD_005f5194 +
               (long)(int)(&switchD_002f9317::switchdataD_005f5194)[VVar26]);
  switch(VVar26) {
  case ON_UPPER:
    local_a78 = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
    local_a98 = *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems;
    uStack_a90 = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2);
    local_a88 = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4);
    uStack_a80 = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6);
    iVar4 = (this->m_oldUp).m_backend.exp;
    bVar24 = (this->m_oldUp).m_backend.neg;
    pnVar27 = (local_cf8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7._0_4_ = (this->m_oldUp).m_backend.fpclass;
    uVar7._4_4_ = (this->m_oldUp).m_backend.prec_elem;
    local_aa8._0_8_ = *(undefined8 *)(pnVar27[iVar25].m_backend.data._M_elems + 8);
    local_ac8 = *(uint (*) [2])pnVar27[iVar25].m_backend.data._M_elems;
    auStack_ac0 = *(uint (*) [2])(pnVar27[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar27[iVar25].m_backend.data._M_elems + 4;
    local_ab8 = *puVar2;
    uStack_ab4 = puVar2[1];
    uStack_ab0 = puVar2[2];
    uStack_aac = puVar2[3];
    iVar5 = pnVar27[iVar25].m_backend.exp;
    bVar3 = pnVar27[iVar25].m_backend.neg;
    uVar8._0_4_ = pnVar27[iVar25].m_backend.fpclass;
    uVar8._4_4_ = pnVar27[iVar25].m_backend.prec_elem;
    local_d08 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)r;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_768,this);
    local_b78 = local_a98;
    uStack_b70 = uStack_a90;
    local_b68 = local_a88;
    uStack_b60 = uStack_a80;
    local_b58 = local_a78;
    local_bb8.m_backend.data._M_elems[5] = uStack_ab4;
    local_bb8.m_backend.data._M_elems[4] = local_ab8;
    local_bb8.m_backend.data._M_elems[7] = uStack_aac;
    local_bb8.m_backend.data._M_elems[6] = uStack_ab0;
    local_bb8.m_backend.data._M_elems[0] = local_ac8[0];
    local_bb8.m_backend.data._M_elems[1] = local_ac8[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_ac0[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_ac0[1];
    local_bb8.m_backend.data._M_elems[8] = local_aa8[0];
    local_bb8.m_backend.data._M_elems[9] = local_aa8[1];
    local_bb8.m_backend.exp = iVar5;
    local_bb8.m_backend.neg = bVar3;
    local_bb8.m_backend._48_8_ = uVar8;
    local_b50 = iVar4;
    local_b4c = bVar24;
    local_b48 = uVar7;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    if (((local_bf0.m_backend.fpclass != 2) && (local_768.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,&local_768), iVar25 < 1)) {
LAB_002f9c93:
      iVar25 = this->m_i;
      rStatus->data[iVar25] = BASIC;
      pnVar29 = (local_d00->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8) =
           *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
      uVar30 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
      uVar19 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
      puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar2 + 2) = uVar20;
      *(undefined8 *)&pnVar29[iVar25].m_backend.data = uVar30;
      *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2) = uVar19;
      pnVar29[iVar25].m_backend.exp = (this->m_row_obj).m_backend.exp;
      pnVar29[iVar25].m_backend.neg = (this->m_row_obj).m_backend.neg;
      iVar21 = (this->m_row_obj).m_backend.prec_elem;
      pnVar29[iVar25].m_backend.fpclass = (this->m_row_obj).m_backend.fpclass;
      pnVar29[iVar25].m_backend.prec_elem = iVar21;
      iVar25 = this->m_j;
      pnVar29 = *(pointer *)(local_d08->m_backend).data._M_elems;
      goto LAB_002fa516;
    }
    pVVar36 = local_cf8;
    local_cf0->data[this->m_j] = BASIC;
    local_4c8.fpclass = cpp_dec_float_finite;
    local_4c8.prec_elem = 10;
    local_4c8.data._M_elems[0] = 0;
    local_4c8.data._M_elems[1] = 0;
    local_4c8.data._M_elems[2] = 0;
    local_4c8.data._M_elems[3] = 0;
    local_4c8.data._M_elems[4] = 0;
    local_4c8.data._M_elems[5] = 0;
    local_4c8.data._M_elems._24_5_ = 0;
    local_4c8.data._M_elems[7]._1_3_ = 0;
    local_4c8.data._M_elems[8] = 0;
    local_4c8.data._M_elems[9] = 0;
    local_4c8.exp = 0;
    local_4c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_4c8,&(this->m_lhs).m_backend,&local_cb0);
    iVar25 = this->m_j;
    pnVar27 = (pVVar36->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_ad8._0_8_ = *(undefined8 *)(pnVar27[iVar25].m_backend.data._M_elems + 8);
    local_af8 = *(uint (*) [2])pnVar27[iVar25].m_backend.data._M_elems;
    auStack_af0 = *(uint (*) [2])(pnVar27[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar27[iVar25].m_backend.data._M_elems + 4;
    local_ae8 = *puVar2;
    uStack_ae4 = puVar2[1];
    uStack_ae0 = puVar2[2];
    uStack_adc = puVar2[3];
    iVar4 = pnVar27[iVar25].m_backend.exp;
    bVar24 = pnVar27[iVar25].m_backend.neg;
    uVar11._0_4_ = pnVar27[iVar25].m_backend.fpclass;
    uVar11._4_4_ = pnVar27[iVar25].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_7a0,this);
    auVar22 = (undefined1  [16])local_4c8.data._M_elems._0_16_;
    uStack_b60 = CONCAT35(local_4c8.data._M_elems[7]._1_3_,local_4c8.data._M_elems._24_5_);
    local_b78._0_4_ = local_4c8.data._M_elems[0];
    local_b78._4_4_ = local_4c8.data._M_elems[1];
    uStack_b70._0_4_ = local_4c8.data._M_elems[2];
    uStack_b70._4_4_ = local_4c8.data._M_elems[3];
    local_b68._0_4_ = local_4c8.data._M_elems[4];
    local_b68._4_4_ = local_4c8.data._M_elems[5];
    local_b58._0_4_ = local_4c8.data._M_elems[8];
    local_b58._4_4_ = local_4c8.data._M_elems[9];
    local_b50 = local_4c8.exp;
    local_b4c = local_4c8.neg;
    local_b48._0_4_ = local_4c8.fpclass;
    local_b48._4_4_ = local_4c8.prec_elem;
    local_bb8.m_backend.data._M_elems[5] = uStack_ae4;
    local_bb8.m_backend.data._M_elems[4] = local_ae8;
    local_bb8.m_backend.data._M_elems[7] = uStack_adc;
    local_bb8.m_backend.data._M_elems[6] = uStack_ae0;
    local_bb8.m_backend.data._M_elems[0] = local_af8[0];
    local_bb8.m_backend.data._M_elems[1] = local_af8[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_af0[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_af0[1];
    local_bb8.m_backend.data._M_elems[8] = local_ad8[0];
    local_bb8.m_backend.data._M_elems[9] = local_ad8[1];
    local_bb8.m_backend.exp = iVar4;
    local_bb8.m_backend.neg = bVar24;
    local_bb8.m_backend._48_8_ = uVar11;
    local_4c8.data._M_elems._0_16_ = auVar22;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    VVar26 = ON_UPPER;
    if (local_bf0.m_backend.fpclass == 2) {
LAB_002fa053:
      VVar26 = ON_UPPER;
      r = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)local_d08;
    }
    else {
      r = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)local_d08;
      if (local_7a0.fpclass != cpp_dec_float_NaN) {
        pcVar33 = &local_7a0;
LAB_002fa045:
        r = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)local_d08;
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,pcVar33);
        VVar26 = (VarStatus)(iVar25 < 1);
      }
    }
    break;
  case ON_LOWER:
    local_9e8 = *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8);
    local_a08 = *(undefined8 *)(this->m_oldLo).m_backend.data._M_elems;
    uStack_a00 = *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2);
    local_9f8 = *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4);
    uStack_9f0 = *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6);
    iVar4 = (this->m_oldLo).m_backend.exp;
    bVar24 = (this->m_oldLo).m_backend.neg;
    pnVar27 = (local_cf8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9._0_4_ = (this->m_oldLo).m_backend.fpclass;
    uVar9._4_4_ = (this->m_oldLo).m_backend.prec_elem;
    local_a18._0_8_ = *(undefined8 *)(pnVar27[iVar25].m_backend.data._M_elems + 8);
    local_a38 = *(uint (*) [2])pnVar27[iVar25].m_backend.data._M_elems;
    auStack_a30 = *(uint (*) [2])(pnVar27[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar27[iVar25].m_backend.data._M_elems + 4;
    local_a28 = *puVar2;
    uStack_a24 = puVar2[1];
    uStack_a20 = puVar2[2];
    uStack_a1c = puVar2[3];
    iVar5 = pnVar27[iVar25].m_backend.exp;
    bVar3 = pnVar27[iVar25].m_backend.neg;
    uVar10._0_4_ = pnVar27[iVar25].m_backend.fpclass;
    uVar10._4_4_ = pnVar27[iVar25].m_backend.prec_elem;
    local_d08 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)r;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_6f8,this);
    local_b78 = local_a08;
    uStack_b70 = uStack_a00;
    local_b68 = local_9f8;
    uStack_b60 = uStack_9f0;
    local_b58 = local_9e8;
    local_bb8.m_backend.data._M_elems[5] = uStack_a24;
    local_bb8.m_backend.data._M_elems[4] = local_a28;
    local_bb8.m_backend.data._M_elems[7] = uStack_a1c;
    local_bb8.m_backend.data._M_elems[6] = uStack_a20;
    local_bb8.m_backend.data._M_elems[0] = local_a38[0];
    local_bb8.m_backend.data._M_elems[1] = local_a38[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_a30[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_a30[1];
    local_bb8.m_backend.data._M_elems[8] = local_a18[0];
    local_bb8.m_backend.data._M_elems[9] = local_a18[1];
    local_bb8.m_backend.exp = iVar5;
    local_bb8.m_backend.neg = bVar3;
    local_bb8.m_backend._48_8_ = uVar10;
    local_b50 = iVar4;
    local_b4c = bVar24;
    local_b48 = uVar9;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    if (((local_bf0.m_backend.fpclass != 2) && (local_6f8.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,&local_6f8), iVar25 < 1)) goto LAB_002f9c93;
    pVVar36 = local_cf8;
    local_cf0->data[this->m_j] = BASIC;
    local_488.fpclass = cpp_dec_float_finite;
    local_488.prec_elem = 10;
    local_488.data._M_elems[0] = 0;
    local_488.data._M_elems[1] = 0;
    local_488.data._M_elems[2] = 0;
    local_488.data._M_elems[3] = 0;
    local_488.data._M_elems[4] = 0;
    local_488.data._M_elems[5] = 0;
    local_488.data._M_elems._24_5_ = 0;
    local_488.data._M_elems[7]._1_3_ = 0;
    local_488.data._M_elems[8] = 0;
    local_488.data._M_elems[9] = 0;
    local_488.exp = 0;
    local_488.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_488,&(this->m_lhs).m_backend,&local_cb0);
    iVar25 = this->m_j;
    pnVar27 = (pVVar36->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a48._0_8_ = *(undefined8 *)(pnVar27[iVar25].m_backend.data._M_elems + 8);
    local_a68 = *(uint (*) [2])pnVar27[iVar25].m_backend.data._M_elems;
    auStack_a60 = *(uint (*) [2])(pnVar27[iVar25].m_backend.data._M_elems + 2);
    puVar2 = pnVar27[iVar25].m_backend.data._M_elems + 4;
    local_a58 = *puVar2;
    uStack_a54 = puVar2[1];
    uStack_a50 = puVar2[2];
    uStack_a4c = puVar2[3];
    iVar4 = pnVar27[iVar25].m_backend.exp;
    bVar24 = pnVar27[iVar25].m_backend.neg;
    uVar12._0_4_ = pnVar27[iVar25].m_backend.fpclass;
    uVar12._4_4_ = pnVar27[iVar25].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_730,this);
    auVar22 = (undefined1  [16])local_488.data._M_elems._0_16_;
    uStack_b60 = CONCAT35(local_488.data._M_elems[7]._1_3_,local_488.data._M_elems._24_5_);
    local_b78._0_4_ = local_488.data._M_elems[0];
    local_b78._4_4_ = local_488.data._M_elems[1];
    uStack_b70._0_4_ = local_488.data._M_elems[2];
    uStack_b70._4_4_ = local_488.data._M_elems[3];
    local_b68._0_4_ = local_488.data._M_elems[4];
    local_b68._4_4_ = local_488.data._M_elems[5];
    local_b58._0_4_ = local_488.data._M_elems[8];
    local_b58._4_4_ = local_488.data._M_elems[9];
    local_b50 = local_488.exp;
    local_b4c = local_488.neg;
    local_b48._0_4_ = local_488.fpclass;
    local_b48._4_4_ = local_488.prec_elem;
    local_bb8.m_backend.data._M_elems[5] = uStack_a54;
    local_bb8.m_backend.data._M_elems[4] = local_a58;
    local_bb8.m_backend.data._M_elems[7] = uStack_a4c;
    local_bb8.m_backend.data._M_elems[6] = uStack_a50;
    local_bb8.m_backend.data._M_elems[0] = local_a68[0];
    local_bb8.m_backend.data._M_elems[1] = local_a68[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_a60[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_a60[1];
    local_bb8.m_backend.data._M_elems[8] = local_a48[0];
    local_bb8.m_backend.data._M_elems[9] = local_a48[1];
    local_bb8.m_backend.exp = iVar4;
    local_bb8.m_backend.neg = bVar24;
    local_bb8.m_backend._48_8_ = uVar12;
    local_488.data._M_elems._0_16_ = auVar22;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    VVar26 = ON_UPPER;
    if (local_bf0.m_backend.fpclass == 2) goto LAB_002fa053;
    r = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)local_d08;
    if (local_730.fpclass != cpp_dec_float_NaN) {
      pcVar33 = &local_730;
      goto LAB_002fa045;
    }
    break;
  case FIXED:
    if ((((local_c38.fpclass != cpp_dec_float_NaN) &&
         ((this->m_oldLo).m_backend.fpclass != cpp_dec_float_NaN)) &&
        (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_c38,&(this->m_oldLo).m_backend), iVar25 < 1)) &&
       (((local_c78.fpclass != cpp_dec_float_NaN &&
         ((this->m_oldUp).m_backend.fpclass != cpp_dec_float_NaN)) &&
        (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_c78,&(this->m_oldUp).m_backend), -1 < iVar25)))) {
LAB_002fa34e:
      iVar25 = this->m_i;
      pVVar28 = rStatus->data;
LAB_002fa117:
      lVar34 = (long)iVar25;
      pVVar28[lVar34] = BASIC;
      pnVar29 = (local_d00->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
           *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
      uVar30 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
      uVar19 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
      puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar2 + 2) = uVar20;
      *(undefined8 *)&pnVar29[lVar34].m_backend.data = uVar30;
      *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = uVar19;
      pnVar29[lVar34].m_backend.exp = (this->m_row_obj).m_backend.exp;
      pnVar29[lVar34].m_backend.neg = (this->m_row_obj).m_backend.neg;
      local_ce8.fpclass = (this->m_row_obj).m_backend.fpclass;
      local_ce8.prec_elem = (this->m_row_obj).m_backend.prec_elem;
      goto LAB_002fa55d;
    }
    uVar20 = local_c38._48_8_;
    bVar3 = local_c38.neg;
    iVar4 = local_c38.exp;
    auVar23 = (undefined1  [16])local_c38.data._M_elems._0_16_;
    uVar30 = local_c78._48_8_;
    bVar24 = local_c78.neg;
    iVar25 = local_c78.exp;
    auVar22 = (undefined1  [16])local_c78.data._M_elems._0_16_;
    local_7a8[0] = local_c38.data._M_elems[8];
    local_7a8[1] = local_c38.data._M_elems[9];
    uStack_7b0 = CONCAT35(local_c38.data._M_elems[7]._1_3_,local_c38.data._M_elems._24_5_);
    local_7b8[0] = local_c38.data._M_elems[4];
    local_7b8[1] = local_c38.data._M_elems[5];
    local_7c8[0] = local_c38.data._M_elems[0];
    local_7c8[1] = local_c38.data._M_elems[1];
    auStack_7c0[0] = local_c38.data._M_elems[2];
    auStack_7c0[1] = local_c38.data._M_elems[3];
    local_7f8[0] = local_c78.data._M_elems[0];
    local_7f8[1] = local_c78.data._M_elems[1];
    auStack_7f0[0] = local_c78.data._M_elems[2];
    auStack_7f0[1] = local_c78.data._M_elems[3];
    local_7e8 = local_c78.data._M_elems[4];
    uStack_7e4 = local_c78.data._M_elems[5];
    uStack_7e0 = local_c78.data._M_elems[6];
    uStack_7dc = local_c78.data._M_elems[7];
    local_7d8[0] = local_c78.data._M_elems[8];
    local_7d8[1] = local_c78.data._M_elems[9];
    local_d08 = &this->m_oldLo;
    local_c78.data._M_elems._0_16_ = auVar22;
    local_c38.data._M_elems._0_16_ = auVar23;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_570,this);
    uVar13 = local_c38._48_8_;
    uVar19 = local_c78._48_8_;
    local_b78._0_4_ = local_7c8[0];
    local_b78._4_4_ = local_7c8[1];
    uStack_b70._0_4_ = auStack_7c0[0];
    uStack_b70._4_4_ = auStack_7c0[1];
    local_b68._0_4_ = local_7b8[0];
    local_b68._4_4_ = local_7b8[1];
    uStack_b60 = uStack_7b0;
    local_b58._0_4_ = local_7a8[0];
    local_b58._4_4_ = local_7a8[1];
    local_b50 = iVar4;
    local_b4c = bVar3;
    local_c38.fpclass = (fpclass_type)uVar20;
    local_c38.prec_elem = SUB84(uVar20,4);
    local_b48._0_4_ = local_c38.fpclass;
    local_b48._4_4_ = local_c38.prec_elem;
    local_bb8.m_backend.data._M_elems[5] = uStack_7e4;
    local_bb8.m_backend.data._M_elems[4] = local_7e8;
    local_bb8.m_backend.data._M_elems[7] = uStack_7dc;
    local_bb8.m_backend.data._M_elems[6] = uStack_7e0;
    local_bb8.m_backend.data._M_elems[0] = local_7f8[0];
    local_bb8.m_backend.data._M_elems[1] = local_7f8[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_7f0[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_7f0[1];
    local_bb8.m_backend.data._M_elems[8] = local_7d8[0];
    local_bb8.m_backend.data._M_elems[9] = local_7d8[1];
    local_bb8.m_backend.exp = iVar25;
    local_bb8.m_backend.neg = bVar24;
    local_c78.fpclass = (fpclass_type)uVar30;
    local_c78.prec_elem = SUB84(uVar30,4);
    local_bb8.m_backend.fpclass = local_c78.fpclass;
    local_bb8.m_backend.prec_elem = local_c78.prec_elem;
    local_c78._48_8_ = uVar19;
    local_c38._48_8_ = uVar13;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)(local_bf0.m_backend._48_8_ & 0xffffffff);
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    if (((local_bf0.m_backend.fpclass == 2) || (local_570.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,&local_570), 0 < iVar25)) {
      uVar30 = local_c38._48_8_;
      bVar3 = local_c38.neg;
      iVar4 = local_c38.exp;
      auVar22 = (undefined1  [16])local_c38.data._M_elems._0_16_;
      local_928[0] = local_c38.data._M_elems[8];
      local_928[1] = local_c38.data._M_elems[9];
      uStack_930 = CONCAT35(local_c38.data._M_elems[7]._1_3_,local_c38.data._M_elems._24_5_);
      local_938[0] = local_c38.data._M_elems[4];
      local_938[1] = local_c38.data._M_elems[5];
      local_948[0] = local_c38.data._M_elems[0];
      local_948[1] = local_c38.data._M_elems[1];
      auStack_940[0] = local_c38.data._M_elems[2];
      auStack_940[1] = local_c38.data._M_elems[3];
      local_978 = *(uint (*) [2])(this->m_oldUp).m_backend.data._M_elems;
      auStack_970 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 2);
      local_968 = (this->m_oldUp).m_backend.data._M_elems[4];
      uStack_964 = (this->m_oldUp).m_backend.data._M_elems[5];
      uStack_960 = (this->m_oldUp).m_backend.data._M_elems[6];
      uStack_95c = (this->m_oldUp).m_backend.data._M_elems[7];
      local_958._0_8_ = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
      iVar25 = (this->m_oldUp).m_backend.exp;
      bVar24 = (this->m_oldUp).m_backend.neg;
      uVar19._0_4_ = (this->m_oldUp).m_backend.fpclass;
      uVar19._4_4_ = (this->m_oldUp).m_backend.prec_elem;
      local_c38.data._M_elems._0_16_ = auVar22;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_688,this);
      uVar20 = local_c38._48_8_;
      local_b78._0_4_ = local_948[0];
      local_b78._4_4_ = local_948[1];
      uStack_b70._0_4_ = auStack_940[0];
      uStack_b70._4_4_ = auStack_940[1];
      local_b68._0_4_ = local_938[0];
      local_b68._4_4_ = local_938[1];
      uStack_b60 = uStack_930;
      local_b58._0_4_ = local_928[0];
      local_b58._4_4_ = local_928[1];
      local_b50 = iVar4;
      local_b4c = bVar3;
      local_c38.fpclass = (fpclass_type)uVar30;
      local_c38.prec_elem = SUB84(uVar30,4);
      local_b48._0_4_ = local_c38.fpclass;
      local_b48._4_4_ = local_c38.prec_elem;
      local_bb8.m_backend.data._M_elems[5] = uStack_964;
      local_bb8.m_backend.data._M_elems[4] = local_968;
      local_bb8.m_backend.data._M_elems[7] = uStack_95c;
      local_bb8.m_backend.data._M_elems[6] = uStack_960;
      local_bb8.m_backend.data._M_elems[0] = local_978[0];
      local_bb8.m_backend.data._M_elems[1] = local_978[1];
      local_bb8.m_backend.data._M_elems[2] = auStack_970[0];
      local_bb8.m_backend.data._M_elems[3] = auStack_970[1];
      local_bb8.m_backend.data._M_elems[8] = local_958[0];
      local_bb8.m_backend.data._M_elems[9] = local_958[1];
      local_c38._48_8_ = uVar20;
      local_bb8.m_backend.exp = iVar25;
      local_bb8.m_backend.neg = bVar24;
      local_bb8.m_backend._48_8_ = uVar19;
      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
      local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
      local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
      local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
      local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
      local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
      local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
      local_d48.exp = local_bf0.m_backend.exp;
      local_d48.neg = local_bf0.m_backend.neg;
      local_d48.fpclass = local_bf0.m_backend.fpclass;
      local_d48.prec_elem = local_bf0.m_backend.prec_elem;
      pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(local_bf0.m_backend._48_8_ & 0xffffffff);
      if ((local_bf0.m_backend.neg == true) &&
         (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
        local_d48.neg = false;
      }
      if (((local_bf0.m_backend.fpclass == 2) || (local_688.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_d48,&local_688), 0 < iVar25)) {
        uVar30 = local_c78._48_8_;
        bVar3 = local_c78.neg;
        iVar25 = local_c78.exp;
        auVar22 = (undefined1  [16])local_c78.data._M_elems._0_16_;
        local_988[0] = local_c78.data._M_elems[8];
        local_988[1] = local_c78.data._M_elems[9];
        local_998[1] = local_c78.data._M_elems[5];
        local_998[0] = local_c78.data._M_elems[4];
        uStack_990 = CONCAT44(local_c78.data._M_elems[7],local_c78.data._M_elems[6]);
        local_9a8[0] = local_c78.data._M_elems[0];
        local_9a8[1] = local_c78.data._M_elems[1];
        auStack_9a0[0] = local_c78.data._M_elems[2];
        auStack_9a0[1] = local_c78.data._M_elems[3];
        local_9d8 = *(uint (*) [2])(local_d08->m_backend).data._M_elems;
        auStack_9d0 = *(uint (*) [2])((local_d08->m_backend).data._M_elems + 2);
        local_9c8 = (local_d08->m_backend).data._M_elems[4];
        uStack_9c4 = (local_d08->m_backend).data._M_elems[5];
        uStack_9c0 = (local_d08->m_backend).data._M_elems[6];
        uStack_9bc = (local_d08->m_backend).data._M_elems[7];
        local_9b8._0_8_ = *(undefined8 *)((local_d08->m_backend).data._M_elems + 8);
        local_d08 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(local_d08._4_4_,(this->m_oldLo).m_backend.exp);
        bVar24 = (this->m_oldLo).m_backend.neg;
        uVar20._0_4_ = (this->m_oldLo).m_backend.fpclass;
        uVar20._4_4_ = (this->m_oldLo).m_backend.prec_elem;
        local_c78.data._M_elems._0_16_ = auVar22;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_6c0,this);
        uVar19 = local_c78._48_8_;
        local_b78._0_4_ = local_9a8[0];
        local_b78._4_4_ = local_9a8[1];
        uStack_b70._0_4_ = auStack_9a0[0];
        uStack_b70._4_4_ = auStack_9a0[1];
        local_b68._0_4_ = local_998[0];
        local_b68._4_4_ = local_998[1];
        uStack_b60 = uStack_990;
        local_b58._0_4_ = local_988[0];
        local_b58._4_4_ = local_988[1];
        local_b50 = iVar25;
        local_b4c = bVar3;
        local_c78.fpclass = (fpclass_type)uVar30;
        local_c78.prec_elem = SUB84(uVar30,4);
        local_b48._0_4_ = local_c78.fpclass;
        local_b48._4_4_ = local_c78.prec_elem;
        local_bb8.m_backend.data._M_elems[5] = uStack_9c4;
        local_bb8.m_backend.data._M_elems[4] = local_9c8;
        local_bb8.m_backend.data._M_elems[7] = uStack_9bc;
        local_bb8.m_backend.data._M_elems[6] = uStack_9c0;
        local_bb8.m_backend.data._M_elems[0] = local_9d8[0];
        local_bb8.m_backend.data._M_elems[1] = local_9d8[1];
        local_bb8.m_backend.data._M_elems[2] = auStack_9d0[0];
        local_bb8.m_backend.data._M_elems[3] = auStack_9d0[1];
        local_bb8.m_backend.data._M_elems[8] = local_9b8[0];
        local_bb8.m_backend.data._M_elems[9] = local_9b8[1];
        local_bb8.m_backend.exp = (int)local_d08;
        local_c78._48_8_ = uVar19;
        local_bb8.m_backend.neg = bVar24;
        local_bb8.m_backend._48_8_ = uVar20;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
        local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
        local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
        local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
        local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
        local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
        local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
        local_d48.exp = local_bf0.m_backend.exp;
        local_d48.neg = local_bf0.m_backend.neg;
        local_d48.fpclass = local_bf0.m_backend.fpclass;
        local_d48.prec_elem = local_bf0.m_backend.prec_elem;
        if ((local_bf0.m_backend.neg == true) &&
           (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
          local_d48.neg = false;
        }
        if (((local_bf0.m_backend.fpclass == 2) || (local_6c0.fpclass == cpp_dec_float_NaN)) ||
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_d48,&local_6c0), 0 < iVar25)) {
          iVar25 = this->m_i;
          pVVar28 = rStatus->data;
          goto LAB_002fa117;
        }
        pcVar33 = &(r->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_bf0,this);
        local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
        local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
        local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
        local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
        local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
        local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
        local_d48.exp = local_bf0.m_backend.exp;
        local_d48.neg = local_bf0.m_backend.neg;
        local_d48.fpclass = local_bf0.m_backend.fpclass;
        local_d48.prec_elem = local_bf0.m_backend.prec_elem;
        if (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0) {
          local_d48.neg = (bool)(local_bf0.m_backend.neg ^ 1);
        }
        if (((local_bf0.m_backend.fpclass == 2) || (pcVar33->fpclass == cpp_dec_float_NaN)) ||
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar33,&local_d48), 0 < iVar25)) {
          local_cf0->data[this->m_j] = ON_LOWER;
          iVar25 = this->m_i;
          pVVar28 = rStatus->data;
          goto LAB_002fa4b9;
        }
        local_3d8._0_4_ = cpp_dec_float_finite;
        local_3d8._4_4_ = 10;
        local_408 = (undefined1  [16])0x0;
        local_3f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_3eb = 0;
        auStack_3e8 = SUB1613((undefined1  [16])0x0,3);
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_408,&(this->m_lhs).m_backend,&local_cb0);
        iVar25 = this->m_j;
        pnVar29 = (local_cf8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_448.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
        local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
        local_448.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
        puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
        local_448.m_backend.data._M_elems[4] = *puVar2;
        local_448.m_backend.data._M_elems[5] = puVar2[1];
        local_448.m_backend.data._M_elems[6] = puVar2[2];
        local_448.m_backend.data._M_elems[7] = puVar2[3];
        local_448.m_backend.exp = pnVar29[iVar25].m_backend.exp;
        local_448.m_backend.neg = pnVar29[iVar25].m_backend.neg;
        local_448.m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
        local_448.m_backend.prec_elem = pnVar29[iVar25].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
        bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_408,&local_448,&local_148);
        rStatus->data[this->m_i] = (uint)bVar24;
        local_cf0->data[this->m_j] = BASIC;
      }
      else {
        iVar25 = this->m_j;
        pnVar29 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_d48,this);
        if (((pnVar29[iVar25].m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_d48.fpclass == cpp_dec_float_NaN)) ||
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar29[iVar25].m_backend,&local_d48), iVar25 < 0)) {
          local_cf0->data[this->m_j] = ON_UPPER;
          goto switchD_002f9317_caseD_3;
        }
        local_358._0_4_ = cpp_dec_float_finite;
        local_358._4_4_ = 10;
        local_388 = (undefined1  [16])0x0;
        local_378 = SUB1613((undefined1  [16])0x0,0);
        uStack_36b = 0;
        auStack_368 = SUB1613((undefined1  [16])0x0,3);
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_388,&(this->m_lhs).m_backend,&local_cb0);
        iVar25 = this->m_j;
        pnVar29 = (local_cf8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3c8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
        local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
        local_3c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
        puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
        local_3c8.m_backend.data._M_elems[4] = *puVar2;
        local_3c8.m_backend.data._M_elems[5] = puVar2[1];
        local_3c8.m_backend.data._M_elems[6] = puVar2[2];
        local_3c8.m_backend.data._M_elems[7] = puVar2[3];
        local_3c8.m_backend.exp = pnVar29[iVar25].m_backend.exp;
        local_3c8.m_backend.neg = pnVar29[iVar25].m_backend.neg;
        local_3c8.m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
        local_3c8.m_backend.prec_elem = pnVar29[iVar25].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
        bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_388,&local_3c8,&local_110);
        rStatus->data[this->m_i] = (uint)bVar24;
        local_cf0->data[this->m_j] = BASIC;
      }
      local_d48.fpclass = cpp_dec_float_finite;
      local_d48.prec_elem = 10;
      local_d48.data._M_elems[0] = 0;
      local_d48.data._M_elems[1] = 0;
      local_d48.data._M_elems[2] = 0;
      local_d48.data._M_elems[3] = 0;
      local_d48.data._M_elems[4] = 0;
      local_d48.data._M_elems[5] = 0;
      local_d48.data._M_elems._24_5_ = 0;
      local_d48.data._M_elems[7]._1_3_ = 0;
      local_d48.data._M_elems._32_5_ = 0;
      local_d48.data._M_elems[9]._1_3_ = 0;
      local_d48.exp = 0;
      local_d48.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_d48,&local_ce8,&local_cb0);
      lVar34 = (long)this->m_i;
      pnVar29 = (local_d00->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar34 * 0x38;
      *(ulong *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
           CONCAT35(local_d48.data._M_elems[9]._1_3_,local_d48.data._M_elems._32_5_);
      puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_d48.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_d48.data._M_elems[7]._1_3_,local_d48.data._M_elems._24_5_);
      *(undefined8 *)&pnVar29[lVar34].m_backend.data = local_d48.data._M_elems._0_8_;
      *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = local_d48.data._M_elems._8_8_;
      pnVar29[lVar34].m_backend.exp = local_d48.exp;
      pnVar29[lVar34].m_backend.neg = local_d48.neg;
      uVar30 = local_d48._48_8_;
      goto LAB_002fa0e9;
    }
    local_808 = *(undefined8 *)((local_d08->m_backend).data._M_elems + 8);
    local_828 = *(undefined8 *)(local_d08->m_backend).data._M_elems;
    uStack_820 = *(undefined8 *)((local_d08->m_backend).data._M_elems + 2);
    local_818 = (local_d08->m_backend).data._M_elems[4];
    uStack_814 = (local_d08->m_backend).data._M_elems[5];
    uStack_810 = (local_d08->m_backend).data._M_elems[6];
    uStack_80c = (local_d08->m_backend).data._M_elems[7];
    iVar25 = (this->m_oldLo).m_backend.exp;
    bVar24 = (this->m_oldLo).m_backend.neg;
    local_838._0_8_ = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
    local_848 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 4);
    auStack_840 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 6);
    local_858 = *(uint (*) [2])(this->m_oldUp).m_backend.data._M_elems;
    auStack_850 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 2);
    iVar4 = (this->m_oldUp).m_backend.exp;
    bVar3 = (this->m_oldUp).m_backend.neg;
    uVar13._0_4_ = (this->m_oldLo).m_backend.fpclass;
    uVar13._4_4_ = (this->m_oldLo).m_backend.prec_elem;
    uVar14._0_4_ = (this->m_oldUp).m_backend.fpclass;
    uVar14._4_4_ = (this->m_oldUp).m_backend.prec_elem;
    pnVar27 = local_d08;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_5a8,this);
    local_b68 = CONCAT44(uStack_814,local_818);
    uStack_b60 = CONCAT44(uStack_80c,uStack_810);
    local_b78 = local_828;
    uStack_b70 = uStack_820;
    local_b58 = local_808;
    local_bb8.m_backend.data._M_elems[0] = local_858[0];
    local_bb8.m_backend.data._M_elems[1] = local_858[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_850[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_850[1];
    local_bb8.m_backend.data._M_elems[4] = local_848[0];
    local_bb8.m_backend.data._M_elems[5] = local_848[1];
    local_bb8.m_backend.data._M_elems[6] = auStack_840[0];
    local_bb8.m_backend.data._M_elems[7] = auStack_840[1];
    local_bb8.m_backend.data._M_elems[8] = local_838[0];
    local_bb8.m_backend.data._M_elems[9] = local_838[1];
    local_bb8.m_backend.exp = iVar4;
    local_bb8.m_backend.neg = bVar3;
    local_bb8.m_backend._48_8_ = uVar14;
    local_b50 = iVar25;
    local_b4c = bVar24;
    local_b48 = uVar13;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    pVVar36 = local_cf8;
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    if (((local_bf0.m_backend.fpclass != 2) && (local_5a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,&local_5a8), iVar25 < 1)) goto LAB_002fa34e;
    local_868._0_8_ = *(undefined8 *)((local_d08->m_backend).data._M_elems + 8);
    local_888 = *(uint (*) [2])(local_d08->m_backend).data._M_elems;
    auStack_880 = *(uint (*) [2])((local_d08->m_backend).data._M_elems + 2);
    local_878 = *(uint (*) [2])((local_d08->m_backend).data._M_elems + 4);
    uStack_870 = *(undefined8 *)((local_d08->m_backend).data._M_elems + 6);
    iVar25 = (this->m_oldLo).m_backend.exp;
    bVar24 = (this->m_oldLo).m_backend.neg;
    iVar4 = this->m_j;
    pnVar27 = (pVVar36->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15._0_4_ = (this->m_oldLo).m_backend.fpclass;
    uVar15._4_4_ = (this->m_oldLo).m_backend.prec_elem;
    local_898._0_8_ = *(undefined8 *)(pnVar27[iVar4].m_backend.data._M_elems + 8);
    local_8b8 = *(uint (*) [2])pnVar27[iVar4].m_backend.data._M_elems;
    auStack_8b0 = *(uint (*) [2])(pnVar27[iVar4].m_backend.data._M_elems + 2);
    puVar2 = pnVar27[iVar4].m_backend.data._M_elems + 4;
    local_8a8 = *puVar2;
    uStack_8a4 = puVar2[1];
    uStack_8a0 = puVar2[2];
    uStack_89c = puVar2[3];
    iVar5 = pnVar27[iVar4].m_backend.exp;
    bVar3 = pnVar27[iVar4].m_backend.neg;
    uVar16._0_4_ = pnVar27[iVar4].m_backend.fpclass;
    uVar16._4_4_ = pnVar27[iVar4].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_5e0,this);
    local_b78._0_4_ = local_888[0];
    local_b78._4_4_ = local_888[1];
    uStack_b70._0_4_ = auStack_880[0];
    uStack_b70._4_4_ = auStack_880[1];
    local_b68._0_4_ = local_878[0];
    local_b68._4_4_ = local_878[1];
    uStack_b60 = uStack_870;
    local_b58._0_4_ = local_868[0];
    local_b58._4_4_ = local_868[1];
    local_bb8.m_backend.data._M_elems[5] = uStack_8a4;
    local_bb8.m_backend.data._M_elems[4] = local_8a8;
    local_bb8.m_backend.data._M_elems[7] = uStack_89c;
    local_bb8.m_backend.data._M_elems[6] = uStack_8a0;
    local_bb8.m_backend.data._M_elems[0] = local_8b8[0];
    local_bb8.m_backend.data._M_elems[1] = local_8b8[1];
    local_bb8.m_backend.data._M_elems[2] = auStack_8b0[0];
    local_bb8.m_backend.data._M_elems[3] = auStack_8b0[1];
    local_bb8.m_backend.data._M_elems[8] = local_898[0];
    local_bb8.m_backend.data._M_elems[9] = local_898[1];
    local_bb8.m_backend.exp = iVar5;
    local_bb8.m_backend.neg = bVar3;
    local_bb8.m_backend._48_8_ = uVar16;
    local_b50 = iVar25;
    local_b4c = bVar24;
    local_b48 = uVar15;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
    local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
    local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
    local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
    local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
    local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
    local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
    local_d48.exp = local_bf0.m_backend.exp;
    local_d48.neg = local_bf0.m_backend.neg;
    local_d48.fpclass = local_bf0.m_backend.fpclass;
    local_d48.prec_elem = local_bf0.m_backend.prec_elem;
    if ((local_bf0.m_backend.neg == true) &&
       (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
      local_d48.neg = false;
    }
    pVVar36 = local_cf8;
    if (((local_bf0.m_backend.fpclass == 2) || (local_5e0.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d48,&local_5e0), pVVar36 = local_cf8, 0 < iVar25)) {
LAB_002fa7bf:
      local_bf8 = &this->m_oldUp;
      local_8c8._0_8_ = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8);
      local_8e8 = *(uint (*) [2])(local_bf8->m_backend).data._M_elems;
      auStack_8e0 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 2);
      local_8d8 = *(uint (*) [2])((this->m_oldUp).m_backend.data._M_elems + 4);
      uStack_8d0 = *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6);
      iVar25 = (this->m_oldUp).m_backend.exp;
      bVar24 = (this->m_oldUp).m_backend.neg;
      iVar4 = this->m_j;
      pnVar27 = (pVVar36->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17._0_4_ = (this->m_oldUp).m_backend.fpclass;
      uVar17._4_4_ = (this->m_oldUp).m_backend.prec_elem;
      local_8f8._0_8_ = *(undefined8 *)(pnVar27[iVar4].m_backend.data._M_elems + 8);
      local_918 = *(uint (*) [2])pnVar27[iVar4].m_backend.data._M_elems;
      auStack_910 = *(uint (*) [2])(pnVar27[iVar4].m_backend.data._M_elems + 2);
      puVar2 = pnVar27[iVar4].m_backend.data._M_elems + 4;
      local_908 = *puVar2;
      uStack_904 = puVar2[1];
      uStack_900 = puVar2[2];
      uStack_8fc = puVar2[3];
      iVar5 = pnVar27[iVar4].m_backend.exp;
      bVar3 = pnVar27[iVar4].m_backend.neg;
      uVar18._0_4_ = pnVar27[iVar4].m_backend.fpclass;
      uVar18._4_4_ = pnVar27[iVar4].m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_618,this);
      local_b78._0_4_ = local_8e8[0];
      local_b78._4_4_ = local_8e8[1];
      uStack_b70._0_4_ = auStack_8e0[0];
      uStack_b70._4_4_ = auStack_8e0[1];
      local_b68._0_4_ = local_8d8[0];
      local_b68._4_4_ = local_8d8[1];
      uStack_b60 = uStack_8d0;
      local_b58._0_4_ = local_8c8[0];
      local_b58._4_4_ = local_8c8[1];
      local_bb8.m_backend.data._M_elems[5] = uStack_904;
      local_bb8.m_backend.data._M_elems[4] = local_908;
      local_bb8.m_backend.data._M_elems[7] = uStack_8fc;
      local_bb8.m_backend.data._M_elems[6] = uStack_900;
      local_bb8.m_backend.data._M_elems[0] = local_918[0];
      local_bb8.m_backend.data._M_elems[1] = local_918[1];
      local_bb8.m_backend.data._M_elems[2] = auStack_910[0];
      local_bb8.m_backend.data._M_elems[3] = auStack_910[1];
      local_bb8.m_backend.data._M_elems[8] = local_8f8[0];
      local_bb8.m_backend.data._M_elems[9] = local_8f8[1];
      local_bb8.m_backend.exp = iVar5;
      local_bb8.m_backend.neg = bVar3;
      local_bb8.m_backend._48_8_ = uVar18;
      local_b50 = iVar25;
      local_b4c = bVar24;
      local_b48 = uVar17;
      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_bf0,(soplex *)&local_b78,&local_bb8,pnVar27);
      local_d48.data._M_elems._32_5_ = local_bf0.m_backend.data._M_elems._32_5_;
      local_d48.data._M_elems[9]._1_3_ = local_bf0.m_backend.data._M_elems[9]._1_3_;
      local_d48.data._M_elems[4] = local_bf0.m_backend.data._M_elems[4];
      local_d48.data._M_elems[5] = local_bf0.m_backend.data._M_elems[5];
      local_d48.data._M_elems._24_5_ = local_bf0.m_backend.data._M_elems._24_5_;
      local_d48.data._M_elems[7]._1_3_ = local_bf0.m_backend.data._M_elems[7]._1_3_;
      local_d48.exp = local_bf0.m_backend.exp;
      local_d48.neg = local_bf0.m_backend.neg;
      local_d48.fpclass = local_bf0.m_backend.fpclass;
      local_d48.prec_elem = local_bf0.m_backend.prec_elem;
      if ((local_bf0.m_backend.neg == true) &&
         (local_bf0.m_backend.data._M_elems[0] != 0 || local_bf0.m_backend.fpclass != 0)) {
        local_d48.neg = false;
      }
      pnVar27 = local_d08;
      pVVar36 = local_cf8;
      if (((local_bf0.m_backend.fpclass != 2) && (local_618.fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_d48,&local_618), pVVar36 = local_cf8, pnVar27 = local_d08,
         iVar25 < 1)) {
        iVar25 = this->m_j;
        pnVar29 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_650,this);
        if (((pnVar29[iVar25].m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_650.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar29[iVar25].m_backend,&local_650), -1 < iVar25))
        goto LAB_002fac43;
      }
      local_188.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 8);
      local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
      local_188.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 2);
      local_188.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 4);
      local_188.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 6);
      local_188.m_backend.exp = (this->m_oldLo).m_backend.exp;
      local_188.m_backend.neg = (this->m_oldLo).m_backend.neg;
      local_188.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
      local_188.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
      iVar25 = this->m_j;
      pnVar29 = (pVVar36->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
      local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
      local_1c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
      puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
      local_1c8.m_backend.data._M_elems[4] = *puVar2;
      local_1c8.m_backend.data._M_elems[5] = puVar2[1];
      local_1c8.m_backend.data._M_elems[6] = puVar2[2];
      local_1c8.m_backend.data._M_elems[7] = puVar2[3];
      local_1c8.m_backend.exp = pnVar29[iVar25].m_backend.exp;
      local_1c8.m_backend.neg = pnVar29[iVar25].m_backend.neg;
      local_1c8.m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
      local_1c8.m_backend.prec_elem = pnVar29[iVar25].m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_500,this);
      bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_188,&local_1c8,&local_500);
      if (!bVar24) {
        local_208.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((local_bf8->m_backend).data._M_elems + 8);
        local_208.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(local_bf8->m_backend).data._M_elems;
        local_208.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((local_bf8->m_backend).data._M_elems + 2);
        local_208.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((local_bf8->m_backend).data._M_elems + 4);
        local_208.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((local_bf8->m_backend).data._M_elems + 6);
        local_208.m_backend.exp = (this->m_oldUp).m_backend.exp;
        local_208.m_backend.neg = (this->m_oldUp).m_backend.neg;
        local_208.m_backend.fpclass = (this->m_oldUp).m_backend.fpclass;
        local_208.m_backend.prec_elem = (this->m_oldUp).m_backend.prec_elem;
        iVar25 = this->m_j;
        pnVar29 = (pVVar36->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_248.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
        local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
        local_248.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
        puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
        local_248.m_backend.data._M_elems[4] = *puVar2;
        local_248.m_backend.data._M_elems[5] = puVar2[1];
        local_248.m_backend.data._M_elems[6] = puVar2[2];
        local_248.m_backend.data._M_elems[7] = puVar2[3];
        local_248.m_backend.exp = pnVar29[iVar25].m_backend.exp;
        local_248.m_backend.neg = pnVar29[iVar25].m_backend.neg;
        local_248.m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
        local_248.m_backend.prec_elem = pnVar29[iVar25].m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[6])(&local_538,this);
        bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_208,&local_248,&local_538);
        if (!bVar24) goto LAB_002fac43;
      }
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 8);
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar27->m_backend).data._M_elems + 6);
      local_308.m_backend.exp = (this->m_oldLo).m_backend.exp;
      local_308.m_backend.neg = (this->m_oldLo).m_backend.neg;
      local_308.m_backend.fpclass = (this->m_oldLo).m_backend.fpclass;
      local_308.m_backend.prec_elem = (this->m_oldLo).m_backend.prec_elem;
      iVar25 = this->m_j;
      pnVar29 = (pVVar36->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_348.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 8);
      local_348.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar29[iVar25].m_backend.data;
      local_348.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar29[iVar25].m_backend.data._M_elems + 2);
      puVar2 = pnVar29[iVar25].m_backend.data._M_elems + 4;
      local_348.m_backend.data._M_elems[4] = *puVar2;
      local_348.m_backend.data._M_elems[5] = puVar2[1];
      local_348.m_backend.data._M_elems[6] = puVar2[2];
      local_348.m_backend.data._M_elems[7] = puVar2[3];
      local_348.m_backend.exp = pnVar29[iVar25].m_backend.exp;
      local_348.m_backend.neg = pnVar29[iVar25].m_backend.neg;
      local_348.m_backend.fpclass = pnVar29[iVar25].m_backend.fpclass;
      local_348.m_backend.prec_elem = pnVar29[iVar25].m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
      bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_308,&local_348,&local_d8);
      local_cf0->data[this->m_j] = (uint)bVar24;
      lVar34 = (long)this->m_i;
      rStatus->data[lVar34] = BASIC;
      pnVar29 = (local_d00->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar30 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
      uVar19 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
      uVar20 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
      *(undefined8 *)&pnVar29[lVar34].m_backend.data =
           *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
      *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = uVar30;
      puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar19;
      *(undefined8 *)(puVar2 + 2) = uVar20;
      *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
           *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
      goto LAB_002fa4ef;
    }
    pcVar33 = &(r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    (*(this->super_PostStep)._vptr_PostStep[6])(local_68,this);
    local_b38.data._M_elems[0] = local_68[0];
    local_b38.data._M_elems[1] = local_68[1];
    uVar30 = local_b38.data._M_elems._0_8_;
    local_b38.data._M_elems[2] = auStack_60[0];
    local_b38.data._M_elems[3] = auStack_60[1];
    local_b38.data._M_elems[8] = local_48[0];
    local_b38.data._M_elems[9] = local_48[1];
    local_b38.data._M_elems[4] = local_58[0];
    local_b38.data._M_elems[5] = local_58[1];
    local_b38.data._M_elems[6] = auStack_50[0];
    local_b38.data._M_elems[7] = auStack_50[1];
    local_b38.exp = local_40;
    local_b38.neg = (bool)local_3c;
    local_b38.fpclass = local_38;
    local_b38.prec_elem = iStack_34;
    local_b38.data._M_elems[0] = local_68[0];
    if (local_b38.data._M_elems[0] != 0 || (fpclass_type)_local_38 != cpp_dec_float_finite) {
      local_b38.neg = (bool)(local_3c ^ 1);
    }
    local_b38.data._M_elems._0_8_ = uVar30;
    if ((((fpclass_type)_local_38 == cpp_dec_float_NaN) || (pcVar33->fpclass == cpp_dec_float_NaN))
       || (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar33,&local_b38), 0 < iVar25)) goto LAB_002fa7bf;
LAB_002fac43:
    local_288.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8);
    local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_lhs).m_backend.data._M_elems;
    local_288.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2);
    local_288.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4);
    local_288.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6);
    local_288.m_backend.exp = (this->m_lhs).m_backend.exp;
    local_288.m_backend.neg = (this->m_lhs).m_backend.neg;
    local_288.m_backend.fpclass = (this->m_lhs).m_backend.fpclass;
    local_288.m_backend.prec_elem = (this->m_lhs).m_backend.prec_elem;
    local_298._0_4_ = cpp_dec_float_finite;
    local_298._4_4_ = 10;
    local_2c8 = (undefined1  [16])0x0;
    local_2b8 = SUB1613((undefined1  [16])0x0,0);
    uStack_2ab = 0;
    auStack_2a8 = SUB1613((undefined1  [16])0x0,3);
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_2c8,
               &(pVVar36->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,&local_cb0);
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
    bVar24 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_288,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_2c8,&local_a0);
    rStatus->data[this->m_i] = (uint)bVar24;
    local_cf0->data[this->m_j] = BASIC;
    goto LAB_002fa0a3;
  case ZERO:
switchD_002f9317_caseD_3:
    iVar25 = this->m_i;
    pVVar28 = rStatus->data;
LAB_002fa4b9:
    lVar34 = (long)iVar25;
    pVVar28[lVar34] = BASIC;
    pnVar29 = (local_d00->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
    uVar30 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
    uVar19 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
    uVar20 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
    puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar20;
    *(undefined8 *)&pnVar29[lVar34].m_backend.data = uVar30;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = uVar19;
LAB_002fa4ef:
    pnVar29[lVar34].m_backend.exp = (this->m_row_obj).m_backend.exp;
    pnVar29[lVar34].m_backend.neg = (this->m_row_obj).m_backend.neg;
    *(undefined8 *)&pnVar29[lVar34].m_backend.fpclass =
         *(undefined8 *)&(this->m_row_obj).m_backend.fpclass;
    iVar25 = this->m_j;
    pnVar29 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_002fa516:
    lVar34 = (long)iVar25;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 8) = local_ce8.data._M_elems._32_8_;
    puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_ce8.data._M_elems._16_8_;
    *(undefined8 *)(puVar2 + 2) = local_ce8.data._M_elems._24_8_;
    *(undefined8 *)&pnVar29[lVar34].m_backend.data = local_ce8.data._M_elems._0_8_;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = local_ce8.data._M_elems._8_8_;
    pnVar29[lVar34].m_backend.exp = local_ce8.exp;
    pnVar29[lVar34].m_backend.neg = local_ce8.neg;
LAB_002fa55d:
    *(undefined8 *)&pnVar29[lVar34].m_backend.fpclass = local_ce8._48_8_;
    return;
  case BASIC:
    lVar34 = (long)this->m_i;
    rStatus->data[lVar34] = BASIC;
    pnVar29 = (local_d00->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar35 = lVar34 * 0x38;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
    uVar30 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
    uVar19 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
    uVar20 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
    puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar20;
    *(undefined8 *)&pnVar29[lVar34].m_backend.data = uVar30;
    *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = uVar19;
    pnVar29[lVar34].m_backend.exp = (this->m_row_obj).m_backend.exp;
    pnVar29[lVar34].m_backend.neg = (this->m_row_obj).m_backend.neg;
    uVar30._0_4_ = (this->m_row_obj).m_backend.fpclass;
    uVar30._4_4_ = (this->m_row_obj).m_backend.prec_elem;
    goto LAB_002fa0e9;
  }
  rStatus->data[this->m_i] = VVar26;
LAB_002fa0a3:
  local_d48.neg = false;
  local_d48.exp = 0;
  local_d48.data._M_elems[9]._1_3_ = 0;
  local_d48.data._M_elems._32_5_ = 0;
  local_d48.data._M_elems[7]._1_3_ = 0;
  local_d48.data._M_elems._24_5_ = 0;
  local_d48.data._M_elems[4] = 0;
  local_d48.data._M_elems[5] = 0;
  local_d48.data._M_elems[2] = 0;
  local_d48.data._M_elems[3] = 0;
  local_d48.data._M_elems[0] = 0;
  local_d48.data._M_elems[1] = 0;
  local_d48.fpclass = cpp_dec_float_finite;
  local_d48.prec_elem = 10;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d48,&local_ce8,&local_cb0);
  lVar34 = (long)this->m_i;
  pnVar29 = (local_d00->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar35 = lVar34 * 0x38;
  *(ulong *)(pnVar29[lVar34].m_backend.data._M_elems + 8) =
       CONCAT35(local_d48.data._M_elems[9]._1_3_,local_d48.data._M_elems._32_5_);
  puVar2 = pnVar29[lVar34].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_d48.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_d48.data._M_elems[7]._1_3_,local_d48.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar29[lVar34].m_backend.data = local_d48.data._M_elems._0_8_;
  *(undefined8 *)(pnVar29[lVar34].m_backend.data._M_elems + 2) = local_d48.data._M_elems._8_8_;
  pnVar29[lVar34].m_backend.exp = local_d48.exp;
  pnVar29[lVar34].m_backend.neg = local_d48.neg;
  uVar30 = local_d48._48_8_;
LAB_002fa0e9:
  *(undefined8 *)((long)(&(pnVar29->m_backend).data + 1) + lVar35 + 8U) = uVar30;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((long)this->m_j * 0x38 +
             *(long *)(((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)r)->m_backend).data._M_elems),0.0);
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}